

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O0

void * __thiscall
MmapSysAllocator::Alloc(MmapSysAllocator *this,size_t size,size_t *actual_size,size_t alignment)

{
  int iVar1;
  ulong __len;
  void *pvVar2;
  void *local_68;
  size_t adjust;
  uintptr_t ptr;
  void *result;
  size_t extra;
  uintptr_t ptr_1;
  void *result_1;
  size_t aligned_size;
  size_t alignment_local;
  size_t *actual_size_local;
  size_t size_local;
  MmapSysAllocator *this_local;
  
  if ((FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_skip_mmap & 1) ==
      0) {
    if (pagesize == 0) {
      iVar1 = getpagesize();
      pagesize = (size_t)iVar1;
    }
    aligned_size = alignment;
    if (alignment < pagesize) {
      aligned_size = pagesize;
    }
    __len = (((size + aligned_size) - 1) / aligned_size) * aligned_size;
    if (__len < size) {
      this_local = (MmapSysAllocator *)0x0;
    }
    else {
      if (actual_size != (size_t *)0x0) {
        *actual_size = __len;
      }
      if (((this->hint_ != 0) && (__len < this->hint_ + __len)) &&
         ((this->hint_ & aligned_size - 1) == 0)) {
        pvVar2 = mmap((void *)this->hint_,__len,3,0x22,-1,0);
        if (((ulong)pvVar2 & aligned_size - 1) == 0) {
          this->hint_ = (uintptr_t)((long)pvVar2 + __len);
          return pvVar2;
        }
        munmap(pvVar2,__len);
      }
      result = (void *)0x0;
      if (pagesize < aligned_size) {
        result = (void *)(aligned_size - pagesize);
      }
      pvVar2 = mmap((void *)0x0,(size_t)(__len + (long)result),3,0x22,-1,0);
      if (pvVar2 == (void *)0xffffffffffffffff) {
        this_local = (MmapSysAllocator *)0x0;
      }
      else {
        local_68 = (void *)0x0;
        if (((ulong)pvVar2 & aligned_size - 1) != 0) {
          local_68 = (void *)(aligned_size - ((ulong)pvVar2 & aligned_size - 1));
        }
        if (local_68 != (void *)0x0) {
          munmap(pvVar2,(size_t)local_68);
        }
        if (local_68 < result) {
          munmap((void *)((long)pvVar2 + (long)local_68 + __len),(long)result - (long)local_68);
        }
        this_local = (MmapSysAllocator *)((long)local_68 + (long)pvVar2);
        this->hint_ = (uintptr_t)
                      ((long)&(this_local->super_SysAllocator)._vptr_SysAllocator + __len);
      }
    }
  }
  else {
    this_local = (MmapSysAllocator *)0x0;
  }
  return this_local;
}

Assistant:

void* MmapSysAllocator::Alloc(size_t size, size_t *actual_size,
                              size_t alignment) {
#ifndef HAVE_MMAP
  return nullptr;
#else
  // Check if we should use mmap allocation.
  // FLAGS_malloc_skip_mmap starts out as false (its uninitialized
  // state) and eventually gets initialized to the specified value.  Note
  // that this code runs for a while before the flags are initialized.
  // Chances are we never get here before the flags are initialized since
  // sbrk is used until the heap is exhausted (before mmap is used).
  if (FLAGS_malloc_skip_mmap) {
    return nullptr;
  }

  // Enforce page alignment
  if (pagesize == 0) pagesize = getpagesize();
  if (alignment < pagesize) alignment = pagesize;
  size_t aligned_size = ((size + alignment - 1) / alignment) * alignment;
  if (aligned_size < size) {
    return nullptr;
  }
  size = aligned_size;

  // "actual_size" indicates that the bytes from the returned pointer
  // p up to and including (p + actual_size - 1) have been allocated.
  if (actual_size) {
    *actual_size = size;
  }

  if (hint_ && hint_ + size > size && (hint_ & (alignment - 1)) == 0) {
    // We try to 'continue' previous mapping. But we first check that
    // alignment requirements are met and that it won't overflow
    // address space.
    void* result = mmap(reinterpret_cast<void*>(hint_), size,
                        PROT_READ|PROT_WRITE,
                        MAP_PRIVATE|MAP_ANONYMOUS,
                        -1, 0);

    uintptr_t ptr = reinterpret_cast<uintptr_t>(result);

    // If the new mapping (even if at different address than hint
    // passed) requested alignment, then we return it.
    if ((ptr & (alignment - 1)) == 0) {
      hint_ = ptr + size;
      return result;
    }

    // Otherwise, we unmap and run "full" logic that is able to align
    // to arbitrary alignment. And that doesn't use hint.
    munmap(result, size);
  }

  // Ask for extra memory if alignment > pagesize
  size_t extra = 0;
  if (alignment > pagesize) {
    extra = alignment - pagesize;
  }

  // Note: size + extra does not overflow since:
  //            size + alignment < (1<<NBITS).
  // and        extra <= alignment
  // therefore  size + extra < (1<<NBITS)
  void* result = mmap(nullptr, size + extra,
                      PROT_READ|PROT_WRITE,
                      MAP_PRIVATE|MAP_ANONYMOUS,
                      -1, 0);
  if (result == reinterpret_cast<void*>(MAP_FAILED)) {
    return nullptr;
  }

  // Adjust the return memory so it is aligned
  uintptr_t ptr = reinterpret_cast<uintptr_t>(result);
  size_t adjust = 0;
  if ((ptr & (alignment - 1)) != 0) {
    adjust = alignment - (ptr & (alignment - 1));
  }

  // Return the unused memory to the system
  if (adjust > 0) {
    munmap(reinterpret_cast<void*>(ptr), adjust);
  }
  if (adjust < extra) {
    munmap(reinterpret_cast<void*>(ptr + adjust + size), extra - adjust);
  }

  ptr += adjust;
  hint_ = ptr + size;
  return reinterpret_cast<void*>(ptr);
#endif  // HAVE_MMAP
}